

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

UBool icu_63::isDataLoaded(UErrorCode *pErrorCode)

{
  UBool UVar1;
  UErrorCode *pErrorCode_local;
  
  umtx_initOnce((UInitOnce *)&gCharNamesInitOnce,loadCharNames,pErrorCode);
  UVar1 = ::U_SUCCESS(*pErrorCode);
  return UVar1;
}

Assistant:

static UBool
isDataLoaded(UErrorCode *pErrorCode) {
    umtx_initOnce(gCharNamesInitOnce, &loadCharNames, *pErrorCode);
    return U_SUCCESS(*pErrorCode);
}